

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySet::~IfcPropertySet(IfcPropertySet *this,void **vtt)

{
  void **vtt_local;
  IfcPropertySet *this_local;
  
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot
                    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3])
       = vtt[0x12];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             field_0x88 = vtt[0x13];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             field_0x98 = vtt[0x14];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       vtt[0x15];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
             &(this->super_IfcPropertySetDefinition).field_0xb8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySet,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySet,_1UL> *)
             &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8,
             vtt + 0x10);
  IfcPropertySetDefinition::~IfcPropertySetDefinition(&this->super_IfcPropertySetDefinition,vtt + 1)
  ;
  return;
}

Assistant:

IfcPropertySet() : Object("IfcPropertySet") {}